

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

int utils::scanDir(string *path,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *ret)

{
  DIR *__dirp;
  dirent *pdVar1;
  char s [100];
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  char local_98 [112];
  
  __dirp = opendir((path->_M_dataplus)._M_p);
  while( true ) {
    pdVar1 = readdir(__dirp);
    if (pdVar1 == (dirent *)0x0) break;
    strcpy(local_98,pdVar1->d_name);
    if (local_98[0] != '.') {
      std::__cxx11::string::string((string *)&local_b8,local_98,&local_b9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)ret,&local_b8)
      ;
      std::__cxx11::string::~string((string *)&local_b8);
    }
  }
  closedir(__dirp);
  return (int)((ulong)((long)(ret->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(ret->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start) >> 5);
}

Assistant:

static inline int scanDir(std::string path, std::vector<std::string> &ret) {
  DIR *dir;
  struct dirent *rent;
  dir = opendir(path.c_str());
  char s[100];
  while ((rent = readdir(dir))) {
    strcpy(s, rent->d_name);
    if (s[0] != '.') {
      ret.push_back(s);
    }
  }
  closedir(dir);
  return ret.size();
}